

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_prepro.h
# Opt level: O3

void __thiscall
mp::
ConstraintPreprocessors<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>
::
PreprocessConstraint<mp::PreprocessInfo<mp::CustomFunctionalConstraint<std::array<int,3ul>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::IfThenId>>>
          (ConstraintPreprocessors<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>
           *this,IfThenConstraint *c,
          PreprocessInfo<mp::CustomFunctionalConstraint<std::array<int,_3UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::IfThenId>_>
          *prepro)

{
  double dVar1;
  Type TVar2;
  double dVar3;
  double dVar4;
  int local_20;
  int local_1c;
  initializer_list<int> local_18;
  
  local_20 = (c->
             super_CustomConstraintData<std::array<int,_3UL>,_std::array<int,_0UL>,_mp::IfThenId>).
             args_._M_elems[1];
  local_1c = (c->
             super_CustomConstraintData<std::array<int,_3UL>,_std::array<int,_0UL>,_mp::IfThenId>).
             args_._M_elems[2];
  dVar3 = *(double *)(*(long *)(this + 0x40) + (long)local_1c * 8);
  dVar4 = *(double *)(*(long *)(this + 0x40) + (long)local_20 * 8);
  if (dVar4 <= dVar3) {
    dVar3 = dVar4;
  }
  dVar4 = *(double *)(*(long *)(this + 0x58) + (long)local_1c * 8);
  dVar1 = *(double *)(*(long *)(this + 0x58) + (long)local_20 * 8);
  if (dVar4 <= dVar1) {
    dVar4 = dVar1;
  }
  if (dVar3 <= prepro->lb_) {
    dVar3 = prepro->lb_;
  }
  prepro->lb_ = dVar3;
  if (prepro->ub_ <= dVar4) {
    dVar4 = prepro->ub_;
  }
  prepro->ub_ = dVar4;
  local_18._M_array = &local_20;
  local_18._M_len = 2;
  TVar2 = FlatModel<mp::DefaultFlatModelParams>::common_type<std::initializer_list<int>>
                    ((FlatModel<mp::DefaultFlatModelParams> *)this,&local_18);
  prepro->type_ = TVar2;
  return;
}

Assistant:

void PreprocessConstraint(
      IfThenConstraint& c, PreprocessInfo& prepro) {
    const auto& args = c.GetArguments();
    prepro.narrow_result_bounds(
          std::min(MPD( lb(args[1]) ), MPD( lb(args[2]) )),
        std::max(MPD( ub(args[1]) ), MPD( ub(args[2]) )));
    prepro.set_result_type( MP_DISPATCH(GetModel()).
                            common_type( { args[1], args[2] } ) );
  }